

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFCommon.cpp
# Opt level: O1

bool glTFCommon::Util::ParseDataURI(char *const_uri,size_t uriLen,DataURI *out)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  char cVar7;
  ulong uVar8;
  bool bVar9;
  
  if (const_uri == (char *)0x0) {
    return false;
  }
  if ((*const_uri == '\x10') || (iVar1 = strncmp(const_uri,"data:",5), iVar1 == 0)) {
    out->mediaType = "text/plain";
    out->charset = "US-ASCII";
    out->base64 = false;
    if (*const_uri != '\x10') {
      *const_uri = '\x10';
      const_uri[1] = '\0';
      const_uri[2] = '\0';
      const_uri[3] = '\0';
      const_uri[4] = '\0';
      uVar5 = 5;
      uVar6 = uVar5;
      if ((const_uri[5] != ',') && (const_uri[5] != ';')) {
        const_uri[1] = '\x05';
        uVar2 = 5;
        if (5 < uriLen) {
          uVar2 = uriLen;
        }
        for (; ((uVar6 = uVar5, const_uri[uVar5] != ',' && (const_uri[uVar5] != ';')) &&
               (uVar6 = uVar2, uVar2 != uVar5)); uVar5 = uVar5 + 1) {
        }
      }
      pcVar4 = const_uri + uVar6;
      bVar9 = uVar6 < uriLen;
      if (bVar9) {
        cVar7 = const_uri[uVar6];
        while (cVar7 == ';') {
          uVar5 = uVar6 + 1;
          *pcVar4 = '\0';
          uVar2 = uVar5;
          uVar3 = uVar5;
          if (uVar5 < uriLen) {
            uVar3 = uriLen;
          }
          for (; ((uVar8 = uVar2, const_uri[uVar2] != ',' && (const_uri[uVar2] != ';')) &&
                 (uVar8 = uVar3, uVar2 < uriLen)); uVar2 = uVar2 + 1) {
          }
          iVar1 = strncmp(const_uri + uVar5,"charset=",8);
          if (iVar1 == 0) {
            const_uri[2] = (char)uVar6 + '\t';
          }
          else {
            iVar1 = strncmp(const_uri + uVar5,"base64",6);
            if (iVar1 == 0) {
              const_uri[3] = (char)uVar5;
            }
          }
          pcVar4 = const_uri + uVar8;
          bVar9 = uVar8 < uriLen;
          uVar6 = uVar8;
          if (!bVar9) break;
          cVar7 = const_uri[uVar8];
        }
      }
      if (bVar9) {
        *pcVar4 = '\0';
        cVar7 = (char)uVar6 + '\x01';
      }
      else {
        const_uri[3] = '\0';
        const_uri[1] = '\0';
        const_uri[2] = '\0';
        cVar7 = '\x05';
      }
      const_uri[4] = cVar7;
    }
    if ((long)const_uri[1] != 0) {
      out->mediaType = const_uri + const_uri[1];
    }
    if ((long)const_uri[2] != 0) {
      out->charset = const_uri + const_uri[2];
    }
    if (const_uri[3] != '\0') {
      out->base64 = true;
    }
    cVar7 = const_uri[4];
    out->data = const_uri + cVar7;
    out->dataLength = uriLen - (long)cVar7;
    bVar9 = true;
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool ParseDataURI(const char* const_uri, size_t uriLen, DataURI& out) {
    if (nullptr == const_uri) {
        return false;
    }

    if (const_uri[0] != 0x10) { // we already parsed this uri?
        if (strncmp(const_uri, "data:", 5) != 0) // not a data uri?
            return false;
    }

    // set defaults
    out.mediaType = "text/plain";
    out.charset = "US-ASCII";
    out.base64 = false;

    char* uri = const_cast<char*>(const_uri);
    if (uri[0] != 0x10) {
        uri[0] = 0x10;
        uri[1] = uri[2] = uri[3] = uri[4] = 0;

        size_t i = 5, j;
        if (uri[i] != ';' && uri[i] != ',') { // has media type?
            uri[1] = char(i);
            for (; uri[i] != ';' && uri[i] != ',' && i < uriLen; ++i) {
                // nothing to do!
            }
        }
        while (uri[i] == ';' && i < uriLen) {
            uri[i++] = '\0';
            for (j = i; uri[i] != ';' && uri[i] != ',' && i < uriLen; ++i) {
                // nothing to do!
            }

            if (strncmp(uri + j, "charset=", 8) == 0) {
                uri[2] = char(j + 8);
            }
            else if (strncmp(uri + j, "base64", 6) == 0) {
                uri[3] = char(j);
            }
        }
        if (i < uriLen) {
            uri[i++] = '\0';
            uri[4] = char(i);
        }
        else {
            uri[1] = uri[2] = uri[3] = 0;
            uri[4] = 5;
        }
    }

    if (uri[1] != 0) {
        out.mediaType = uri + uri[1];
    }
    if (uri[2] != 0) {
        out.charset = uri + uri[2];
    }
    if (uri[3] != 0) {
        out.base64 = true;
    }
    out.data = uri + uri[4];
    out.dataLength = (uri + uriLen) - out.data;

    return true;
}